

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogConverterCustomText.h
# Opt level: O0

void __thiscall
nowtech::log::
ConverterCustomText<nowtech::log::MessageCompact<8UL,_true>,_true,_(unsigned_char)'d',_true,_false>
::append<unsigned_long>
          (ConverterCustomText<nowtech::log::MessageCompact<8UL,_true>,_true,_(unsigned_char)_d_,_true,_false>
           *this,unsigned_long aValue,unsigned_long aBase,uint8_t aFill)

{
  byte bVar1;
  byte in_CL;
  ulong in_RDX;
  ulong in_RSI;
  ConverterCustomText<nowtech::log::MessageCompact<8UL,_true>,_true,_(unsigned_char)_d_,_true,_false>
  *in_RDI;
  unsigned_long mod;
  bool negative;
  uint8_t where;
  char tmpBuffer [100];
  uint8_t tmpFill;
  unsigned_long tmpValue;
  bool local_b1;
  byte local_99;
  char local_98 [111];
  byte local_29;
  ulong local_28;
  ulong local_18;
  
  if ((in_RDX < 2) || (0x10 < in_RDX)) {
    append(in_RDI,'#');
  }
  else {
    local_29 = in_CL;
    local_28 = in_RSI;
    local_18 = in_RDX;
    if (in_RDX == 2) {
      append(in_RDI,'0');
      append(in_RDI,'b');
    }
    else if (in_RDX == 0x10) {
      append(in_RDI,'0');
      append(in_RDI,'x');
    }
    else if (in_RDX != 10) {
      append(in_RDI,'0');
      append(in_RDI,'!');
    }
    local_99 = 0;
    bVar1 = local_99;
    do {
      local_99 = bVar1;
      local_98[local_99] = "0123456789abcdef"[local_28 % local_18];
      bVar1 = local_99 + 1;
      local_28 = local_28 / local_18;
      local_b1 = local_28 != 0 && bVar1 < 100;
    } while (local_b1);
    if (bVar1 < 100) {
      if (bVar1 < local_29) {
        for (local_29 = local_29 - bVar1; local_29 != 0; local_29 = local_29 - 1) {
          append(in_RDI,'0');
        }
      }
      for (; local_99 != 0; local_99 = local_99 - 1) {
        append(in_RDI,local_98[local_99]);
      }
      append(in_RDI,local_98[0]);
    }
    else {
      append(in_RDI,'#');
    }
  }
  return;
}

Assistant:

void append(tValue const aValue, tValue const aBase, uint8_t const aFill) noexcept {
    tValue tmpValue = aValue;
    uint8_t tmpFill = aFill;
    if((aBase <= NumericSystem::csInvalid) || (aBase > NumericSystem::csBaseMax)) {
      append(csNumericError);
      return;
    }
    else { // nothing to do
    }
    if(tAppendBasePrefix) {
      if (aBase == 2u) {
        append(csNumericFill);
        append(csNumericMarkBinary);
      }
      else if(aBase == 16u) {
        append(csNumericFill);
        append(csNumericMarkHexadecimal);
      }
      else if(aBase != 10u) {
        append(csNumericFill);
        append(csNumericMarkOther);
      }
      else { // nothing to do
      }
    }
    char tmpBuffer[tAppendStackBufferSize];
    uint8_t where = 0u;
    bool negative = aValue < 0;
    do {
      tValue mod = tmpValue % aBase;
      if(mod < 0) {
        mod = -mod;
      }
      else { // nothing to do
      }
      tmpBuffer[where] = csDigit2char[mod];
      ++where;
      tmpValue /= aBase;
    } while((tmpValue != 0) && (where < tAppendStackBufferSize));
    if(where >= tAppendStackBufferSize) {
      append(csNumericError);
      return;
    }
    else { // nothing to do
    }
    if(negative) {
      append(csMinus);
    }
    else if(tAlignSigned && (aFill > 0u)) {
      append(csSpace);
    }
    else { // nothing to do
    }
    if(tmpFill > where) {
      tmpFill -= where;
      while(tmpFill > 0u) {
        append(csNumericFill);
        --tmpFill;
      }
    }
    for(--where; where > 0u; --where) {
      append(tmpBuffer[where]);
    }
    append(tmpBuffer[0]);
  }